

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::resetScaleFactors
          (BeagleCPUImpl<double,_1,_1> *this,int cumulativeScalingIndex)

{
  memset(this->gScaleBuffers[cumulativeScalingIndex],0,
         (long)this->kPaddedPatternCount << ((byte)~(byte)this->kFlags >> 6 | 1));
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::resetScaleFactors(int cumulativeScalingIndex) {
    //memcpy(gScaleBuffers[cumulativeScalingIndex],zeros,sizeof(double) * kPatternCount);

     if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
         memset(gScaleBuffers[cumulativeScalingIndex], 0, sizeof(signed short) * kPaddedPatternCount);
     } else {
         memset(gScaleBuffers[cumulativeScalingIndex], 0, sizeof(REALTYPE) * kPaddedPatternCount);
     }
    return BEAGLE_SUCCESS;
}